

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::default_value_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  Type TVar4;
  uint uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  EnumValueDescriptor *pEVar8;
  EnumDescriptor *pEVar9;
  Descriptor *this_00;
  uint64_t uVar10;
  int64_t iVar11;
  LogMessage *pLVar12;
  uint *b;
  AlphaNum *pAVar13;
  EnumDescriptor *descriptor_00;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  char *in_R9;
  float fVar14;
  float fVar15;
  double dVar16;
  double dVar17;
  string_view sVar18;
  string_view enum_value_name;
  LogMessage local_4f8;
  Voidify local_4e1;
  AlphaNum local_4e0;
  AlphaNum local_4b0;
  AlphaNum local_480;
  AlphaNum local_450;
  AlphaNum local_420;
  AlphaNum local_3f0;
  AlphaNum local_3c0;
  allocator<char> local_38a;
  allocator<char> local_389;
  AlphaNum local_388;
  AlphaNum local_358;
  AlphaNum local_328;
  AlphaNum local_2f8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  AlphaNum local_268;
  AlphaNum local_238;
  AlphaNum local_208;
  AlphaNum local_1d8;
  allocator<char> local_1a7;
  allocator<char> local_1a6;
  allocator<char> local_1a5;
  float local_1a4;
  undefined1 local_1a0 [4];
  float value_1;
  AlphaNum local_170;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  double local_138;
  double value;
  FieldDescriptor *local_128;
  FieldDescriptor *wrapped_field;
  AlphaNum *local_118;
  string_view local_110;
  string local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  string local_70;
  AlphaNum local_50;
  FieldDescriptor *local_20;
  FieldDescriptor *descriptor_local;
  FieldGeneratorBase *this_local;
  
  local_20 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  TVar4 = FieldDescriptor::type(descriptor);
  b = &switchD_004e95a5::switchdataD_00af8bc0;
  switch(TVar4) {
  case TYPE_DOUBLE:
    dVar16 = FieldDescriptor::default_value_double(local_20);
    local_138 = dVar16;
    dVar17 = std::numeric_limits<double>::infinity();
    dVar2 = local_138;
    if ((dVar16 != dVar17) || (NAN(dVar16) || NAN(dVar17))) {
      dVar16 = std::numeric_limits<double>::infinity();
      pAVar13 = (AlphaNum *)0x8000000000000000;
      if ((dVar2 != -dVar16) || (NAN(dVar2) || NAN(-dVar16))) {
        uVar5 = std::isnan(local_138);
        if ((uVar5 & 1) == 0) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_170,local_138);
          absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)local_1a0,"D");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_170,(AlphaNum *)local_1a0,pAVar13
                    );
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"double.NaN",&local_13b);
          std::allocator<char>::~allocator(&local_13b);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"double.NegativeInfinity",&local_13a);
        std::allocator<char>::~allocator(&local_13a);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"double.PositiveInfinity",&local_139);
      std::allocator<char>::~allocator(&local_139);
    }
    break;
  case TYPE_FLOAT:
    fVar14 = FieldDescriptor::default_value_float(local_20);
    local_1a4 = fVar14;
    fVar15 = std::numeric_limits<float>::infinity();
    fVar1 = local_1a4;
    if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
      fVar14 = std::numeric_limits<float>::infinity();
      if ((fVar1 != -fVar14) || (NAN(fVar1) || NAN(-fVar14))) {
        uVar5 = std::isnan((double)(ulong)(uint)local_1a4);
        if ((uVar5 & 1) == 0) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_1d8,local_1a4);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_208,"F");
          absl::lts_20250127::StrCat_abi_cxx11_
                    (__return_storage_ptr__,(lts_20250127 *)&local_1d8,&local_208,(AlphaNum *)b);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"float.NaN",&local_1a7);
          std::allocator<char>::~allocator(&local_1a7);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"float.NegativeInfinity",&local_1a6);
        std::allocator<char>::~allocator(&local_1a6);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"float.PositiveInfinity",&local_1a5);
      std::allocator<char>::~allocator(&local_1a5);
    }
    break;
  case TYPE_INT64:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_238,iVar11);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_268,"L");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_238,&local_268,(AlphaNum *)b);
    break;
  case TYPE_UINT64:
    uVar10 = FieldDescriptor::default_value_uint64(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_298,uVar10);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2c8,"UL");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_298,&local_2c8,(AlphaNum *)b);
    break;
  case TYPE_INT32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_2f8,iVar7);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_2f8,a);
    break;
  case TYPE_FIXED64:
    uVar10 = FieldDescriptor::default_value_uint64(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_328,uVar10);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_358,"UL");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_328,&local_358,(AlphaNum *)b);
    break;
  case TYPE_FIXED32:
    uVar6 = FieldDescriptor::default_value_uint32(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_388,uVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_388,a_00);
    break;
  case TYPE_BOOL:
    bVar3 = FieldDescriptor::default_value_bool(local_20);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"true",&local_389);
      std::allocator<char>::~allocator(&local_389);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"false",&local_38a);
      std::allocator<char>::~allocator(&local_38a);
    }
    break;
  case TYPE_STRING:
    GetStringDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,local_20);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    bVar3 = IsWrapperType(local_20);
    if (bVar3) {
      this_00 = FieldDescriptor::message_type(local_20);
      local_128 = Descriptor::field(this_00,0);
      default_value_abi_cxx11_(__return_storage_ptr__,this,local_128);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"null",(allocator<char> *)((long)&value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    }
    break;
  case TYPE_BYTES:
    GetBytesDefaultValueInternal_abi_cxx11_(__return_storage_ptr__,this,local_20);
    break;
  case TYPE_UINT32:
    uVar6 = FieldDescriptor::default_value_uint32(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3c0,uVar6);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_3c0,a_01);
    break;
  case TYPE_ENUM:
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    pEVar9 = EnumValueDescriptor::type(pEVar8);
    GetClassName_abi_cxx11_(&local_70,(csharp *)pEVar9,descriptor_00);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,".");
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    pEVar9 = EnumValueDescriptor::type(pEVar8);
    local_110 = EnumDescriptor::name(pEVar9);
    pEVar8 = FieldDescriptor::default_value_enum(local_20);
    sVar18 = EnumValueDescriptor::name(pEVar8);
    pAVar13 = (AlphaNum *)sVar18._M_str;
    wrapped_field = (FieldDescriptor *)sVar18._M_len;
    sVar18._M_str = (char *)wrapped_field;
    sVar18._M_len = (size_t)local_110._M_str;
    enum_value_name._M_str = in_R9;
    enum_value_name._M_len = (size_t)pAVar13;
    local_118 = pAVar13;
    GetEnumValueName_abi_cxx11_(&local_100,(csharp *)local_110._M_len,sVar18,enum_value_name);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_e0,&local_100);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_50,&local_b0,&local_e0,pAVar13);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case TYPE_SFIXED32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_3f0,iVar7);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_3f0,a_02);
    break;
  case TYPE_SFIXED64:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_420,iVar11);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_450,"L");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_420,&local_450,(AlphaNum *)b);
    break;
  case TYPE_SINT32:
    iVar7 = FieldDescriptor::default_value_int32(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_480,iVar7);
    absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_480,a_03);
    break;
  case MAX_TYPE:
    iVar11 = FieldDescriptor::default_value_int64(local_20);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4b0,iVar11);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_4e0,"L");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_4b0,&local_4e0,(AlphaNum *)b);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0x195);
    pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_4f8);
    pLVar12 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar12,(char (*) [20])"Unknown field type.");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_4e1,pLVar12);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_4f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::default_value(const FieldDescriptor* descriptor) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
      return absl::StrCat(
          GetClassName(descriptor->default_value_enum()->type()), ".",
          GetEnumValueName(descriptor->default_value_enum()->type()->name(),
                           descriptor->default_value_enum()->name()));
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      if (IsWrapperType(descriptor)) {
        const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
        return default_value(wrapped_field);
      } else {
        return "null";
      }
    case FieldDescriptor::TYPE_DOUBLE: {
      double value = descriptor->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "double.PositiveInfinity";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "double.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "double.NaN";
      }
      return absl::StrCat(value, "D");
    }
    case FieldDescriptor::TYPE_FLOAT: {
      float value = descriptor->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "float.PositiveInfinity";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "float.NegativeInfinity";
      } else if (std::isnan(value)) {
        return "float.NaN";
      }
      return absl::StrCat(value, "F");
    }
    case FieldDescriptor::TYPE_INT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_UINT64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_INT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_FIXED64:
      return absl::StrCat(descriptor->default_value_uint64(), "UL");
    case FieldDescriptor::TYPE_FIXED32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_BOOL:
      if (descriptor->default_value_bool()) {
        return "true";
      } else {
        return "false";
      }
    case FieldDescriptor::TYPE_STRING:
      return GetStringDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_BYTES:
      return GetBytesDefaultValueInternal(descriptor);
    case FieldDescriptor::TYPE_UINT32:
      return absl::StrCat(descriptor->default_value_uint32());
    case FieldDescriptor::TYPE_SFIXED32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SFIXED64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    case FieldDescriptor::TYPE_SINT32:
      return absl::StrCat(descriptor->default_value_int32());
    case FieldDescriptor::TYPE_SINT64:
      return absl::StrCat(descriptor->default_value_int64(), "L");
    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return "";
  }
}